

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

int Wlc_NtkCountObjBits(Wlc_Ntk_t *p,Vec_Int_t *vPisNew)

{
  int iVar1;
  Wlc_Obj_t *pWVar2;
  int iVar3;
  int i;
  int iVar4;
  
  iVar4 = 0;
  for (i = 0; i < vPisNew->nSize; i = i + 1) {
    iVar1 = Vec_IntEntry(vPisNew,i);
    pWVar2 = Wlc_NtkObj(p,iVar1);
    iVar3 = pWVar2->End - pWVar2->Beg;
    iVar1 = -iVar3;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    iVar4 = iVar4 + iVar1 + 1;
  }
  return iVar4;
}

Assistant:

int Wlc_NtkCountObjBits( Wlc_Ntk_t * p, Vec_Int_t * vPisNew )
{
    Wlc_Obj_t * pObj; 
    int i, Count = 0;
    Wlc_NtkForEachObjVec( vPisNew, p, pObj, i )
        Count += Wlc_ObjRange(pObj);
    return Count;
}